

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O3

int bsdunzip_getopt(bsdunzip *bsdunzip)

{
  char **ppcVar1;
  int iVar2;
  char **ppcVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  size_t __n;
  uint __c;
  
  bsdunzip->argument = (char *)0x0;
  switch(bsdunzip->getopt_state) {
  case 0:
    ppcVar1 = bsdunzip->argv;
    ppcVar3 = ppcVar1 + 1;
    bsdunzip->argv = ppcVar3;
    bsdunzip->argc = bsdunzip->argc + -1;
    pcVar6 = ppcVar1[1];
    if (pcVar6 == (char *)0x0) {
      return -1;
    }
    bsdunzip->getopt_state = 1;
    while( true ) {
      if (pcVar6 == (char *)0x0) {
        return -1;
      }
      if (*pcVar6 != '-') {
        return -1;
      }
      if ((pcVar6[1] == '-') && (pcVar6[2] == '\0')) {
        bsdunzip->argv = ppcVar3 + 1;
        bsdunzip->argc = bsdunzip->argc + -1;
        bsdunzip_optind = bsdunzip_optind + 1;
        return -1;
      }
      bsdunzip->argv = ppcVar3 + 1;
      pcVar6 = *ppcVar3;
      bsdunzip->getopt_word = pcVar6;
      bsdunzip->argc = bsdunzip->argc + -1;
      bsdunzip_optind = bsdunzip_optind + 1;
      if (pcVar6[1] == '-') {
        pcVar6 = pcVar6 + 2;
        bsdunzip->getopt_word = pcVar6;
        goto LAB_0010560f;
      }
      pcVar6 = pcVar6 + 1;
      bsdunzip->getopt_state = 2;
LAB_00105587:
      pcVar5 = pcVar6 + 1;
      bsdunzip->getopt_word = pcVar5;
      __c = (uint)*pcVar6;
      if (*pcVar6 != '\0') break;
      bsdunzip->getopt_state = 1;
      bsdunzip->argument = (char *)0x0;
switchD_001054e8_caseD_1:
      ppcVar3 = bsdunzip->argv;
      pcVar6 = *ppcVar3;
    }
    pvVar4 = memchr("aCcd:fI:jLlnO:opP:qtuvx:yZ:",__c,0x1c);
    if (pvVar4 == (void *)0x0) goto LAB_00105678;
    if (*(char *)((long)pvVar4 + 1) != ':') {
      return __c;
    }
    if (*pcVar5 == '\0') {
      pcVar5 = *bsdunzip->argv;
      bsdunzip->getopt_word = pcVar5;
      if (pcVar5 == (char *)0x0) {
        lafe_warnc(0,"Option -%c requires an argument",(ulong)__c);
        goto LAB_00105678;
      }
      bsdunzip->argv = bsdunzip->argv + 1;
      bsdunzip->argc = bsdunzip->argc + -1;
      bsdunzip_optind = bsdunzip_optind + 1;
    }
    bsdunzip->getopt_state = 1;
    bsdunzip->argument = pcVar5;
    break;
  case 1:
    goto switchD_001054e8_caseD_1;
  case 2:
    pcVar6 = bsdunzip->getopt_word;
    goto LAB_00105587;
  case 3:
    pcVar6 = bsdunzip->getopt_word;
LAB_0010560f:
    bsdunzip->getopt_state = 1;
    pcVar5 = strchr(pcVar6,0x3d);
    if (pcVar5 == (char *)0x0) {
      __n = strlen(pcVar6);
    }
    else {
      __n = (long)pcVar5 - (long)pcVar6;
      bsdunzip->argument = pcVar5 + 1;
    }
    if ((*pcVar6 == 'v') && (iVar2 = strncmp(pcVar6,"version",__n), iVar2 == 0)) {
      if (pcVar5 == (char *)0x0) {
        return 1;
      }
      pcVar5 = "Option %s%s does not allow an argument";
      pcVar6 = "version";
    }
    else {
      pcVar5 = "Option %s%s is not supported";
    }
    lafe_warnc(0,pcVar5,"--",pcVar6);
LAB_00105678:
    __c = 0x3f;
    break;
  default:
    return 0;
  }
  return __c;
}

Assistant:

int
bsdunzip_getopt(struct bsdunzip *bsdunzip)
{
	enum { state_start = 0, state_next_word, state_short, state_long };

	const struct bsdunzip_option *popt, *match, *match2;
	const char *p, *long_prefix;
	size_t optlength;
	int opt;
	int required;

again:
	match = NULL;
	match2 = NULL;
	long_prefix = "--";
	opt = OPTION_NONE;
	required = 0;
	bsdunzip->argument = NULL;

	/* First time through, initialize everything. */
	if (bsdunzip->getopt_state == state_start) {
		/* Skip program name. */
		++bsdunzip->argv;
		--bsdunzip->argc;
		if (*bsdunzip->argv == NULL)
			return (-1);
		bsdunzip->getopt_state = state_next_word;
	}

	/*
	 * We're ready to look at the next word in argv.
	 */
	if (bsdunzip->getopt_state == state_next_word) {
		/* No more arguments, so no more options. */
		if (bsdunzip->argv[0] == NULL)
			return (-1);
		/* Doesn't start with '-', so no more options. */
		if (bsdunzip->argv[0][0] != '-')
			return (-1);
		/* "--" marks end of options; consume it and return. */
		if (strcmp(bsdunzip->argv[0], "--") == 0) {
			++bsdunzip->argv;
			--bsdunzip->argc;
			bsdunzip_optind++;
			return (-1);
		}
		/* Get next word for parsing. */
		bsdunzip->getopt_word = *bsdunzip->argv++;
		--bsdunzip->argc;
		bsdunzip_optind++;
		if (bsdunzip->getopt_word[1] == '-') {
			/* Set up long option parser. */
			bsdunzip->getopt_state = state_long;
			bsdunzip->getopt_word += 2; /* Skip leading '--' */
		} else {
			/* Set up short option parser. */
			bsdunzip->getopt_state = state_short;
			++bsdunzip->getopt_word;  /* Skip leading '-' */
		}
	}

	/*
	 * We're parsing a group of POSIX-style single-character options.
	 */
	if (bsdunzip->getopt_state == state_short) {
		/* Peel next option off of a group of short options. */
		opt = *bsdunzip->getopt_word++;
		if (opt == '\0') {
			/* End of this group; recurse to get next option. */
			bsdunzip->getopt_state = state_next_word;
			goto again;
		}

		/* Does this option take an argument? */
		p = strchr(short_options, opt);
		if (p == NULL)
			return ('?');
		if (p[1] == ':')
			required = 1;

		/* If it takes an argument, parse that. */
		if (required) {
			/* If arg is run-in, bsdunzip->getopt_word already points to it. */
			if (bsdunzip->getopt_word[0] == '\0') {
				/* Otherwise, pick up the next word. */
				bsdunzip->getopt_word = *bsdunzip->argv;
				if (bsdunzip->getopt_word == NULL) {
					lafe_warnc(0,
					    "Option -%c requires an argument",
					    opt);
					return ('?');
				}
				++bsdunzip->argv;
				--bsdunzip->argc;
				bsdunzip_optind++;
			}
			bsdunzip->getopt_state = state_next_word;
			bsdunzip->argument = bsdunzip->getopt_word;
		}
	}

	/* We're reading a long option */
	if (bsdunzip->getopt_state == state_long) {
		/* After this long option, we'll be starting a new word. */
		bsdunzip->getopt_state = state_next_word;

		/* Option name ends at '=' if there is one. */
		p = strchr(bsdunzip->getopt_word, '=');
		if (p != NULL) {
			optlength = (size_t)(p - bsdunzip->getopt_word);
			bsdunzip->argument = (char *)(uintptr_t)(p + 1);
		} else {
			optlength = strlen(bsdunzip->getopt_word);
		}

		/* Search the table for an unambiguous match. */
		for (popt = bsdunzip_longopts; popt->name != NULL; popt++) {
			/* Short-circuit if first chars don't match. */
			if (popt->name[0] != bsdunzip->getopt_word[0])
				continue;
			/* If option is a prefix of name in table, record it.*/
			if (strncmp(bsdunzip->getopt_word, popt->name, optlength) == 0) {
				match2 = match; /* Record up to two matches. */
				match = popt;
				/* If it's an exact match, we're done. */
				if (strlen(popt->name) == optlength) {
					match2 = NULL; /* Forget the others. */
					break;
				}
			}
		}

		/* Fail if there wasn't a unique match. */
		if (match == NULL) {
			lafe_warnc(0,
			    "Option %s%s is not supported",
			    long_prefix, bsdunzip->getopt_word);
			return ('?');
		}
		if (match2 != NULL) {
			lafe_warnc(0,
			    "Ambiguous option %s%s (matches --%s and --%s)",
			    long_prefix, bsdunzip->getopt_word, match->name, match2->name);
			return ('?');
		}

		/* We've found a unique match; does it need an argument? */
		if (match->required) {
			/* Argument required: get next word if necessary. */
			if (bsdunzip->argument == NULL) {
				bsdunzip->argument = *bsdunzip->argv;
				if (bsdunzip->argument == NULL) {
					lafe_warnc(0,
					    "Option %s%s requires an argument",
					    long_prefix, match->name);
					return ('?');
				}
				++bsdunzip->argv;
				--bsdunzip->argc;
				bsdunzip_optind++;
			}
		} else {
			/* Argument forbidden: fail if there is one. */
			if (bsdunzip->argument != NULL) {
				lafe_warnc(0,
				    "Option %s%s does not allow an argument",
				    long_prefix, match->name);
				return ('?');
			}
		}
		return (match->equivalent);
	}

	return (opt);
}